

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ExperimentalNs * __thiscall webrtc::Config::Get<webrtc::ExperimentalNs>(Config *this)

{
  bool bVar1;
  pointer ppVar2;
  ExperimentalNs *pEVar3;
  ExperimentalNs *t;
  ConfigOptionID local_24;
  _Self local_20;
  const_iterator it;
  Config *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_24 = identifier<webrtc::ExperimentalNs>();
  local_20._M_node =
       (_Base_ptr)
       std::
       map<webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
       ::find(&this->options_,&local_24);
  t = (ExperimentalNs *)
      std::
      map<webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
      ::end(&this->options_);
  bVar1 = std::operator!=(&local_20,(_Self *)&t);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>
             ::operator->(&local_20);
    if (*(ExperimentalNs **)(ppVar2->second + 8) != (ExperimentalNs *)0x0) {
      return *(ExperimentalNs **)(ppVar2->second + 8);
    }
  }
  pEVar3 = default_value<webrtc::ExperimentalNs>();
  return pEVar3;
}

Assistant:

const T& Config::Get() const {
  OptionMap::const_iterator it = options_.find(identifier<T>());
  if (it != options_.end()) {
    const T* t = static_cast<Option<T>*>(it->second)->value;
    if (t) {
      return *t;
    }
  }
  return default_value<T>();
}